

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  uint64_t uVar2;
  size_type extraout_RDX;
  StringRef ref;
  StringRef name;
  StringRef name_00;
  StringRef SVar3;
  string local_68;
  string local_48;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = testInfo;
  this_00 = &this->m_xml;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TestCase","");
  XmlWriter::startElement(this_00,&local_48,Newline|Indent);
  ref.m_size = extraout_RDX;
  ref.m_start = (char *)(testInfo->name)._M_string_length;
  SVar3 = trim((Catch *)(testInfo->name)._M_dataplus._M_p,ref);
  name.m_size = 4;
  name.m_start = "name";
  XmlWriter::writeAttribute(this_00,name,SVar3);
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_68,testInfo);
  SVar3.m_size = local_68._M_string_length;
  SVar3.m_start = local_68._M_dataplus._M_p;
  name_00.m_size = 4;
  name_00.m_start = "tags";
  XmlWriter::writeAttribute(this_00,name_00,SVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  writeSourceInfo(this,&testInfo->lineInfo);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    uVar2 = std::chrono::_V2::system_clock::now();
    (this->m_testCaseTimer).m_nanoseconds = uVar2;
  }
  XmlWriter::ensureTagClosed(this_00);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name"_sr, trim( StringRef(testInfo.name) ) )
            .writeAttribute( "tags"_sr, testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }